

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O2

float ma_calculate_channel_position_rectangular_weight
                (ma_channel channelPositionA,ma_channel channelPositionB)

{
  undefined3 in_register_00000031;
  uint uVar1;
  undefined3 in_register_00000039;
  uint uVar2;
  
  uVar2 = CONCAT31(in_register_00000039,channelPositionA);
  uVar1 = CONCAT31(in_register_00000031,channelPositionB);
  return g_maChannelPlaneRatios[uVar2][5] * g_maChannelPlaneRatios[uVar1][5] +
         g_maChannelPlaneRatios[uVar2][3] * g_maChannelPlaneRatios[uVar1][3] +
         g_maChannelPlaneRatios[uVar2][2] * g_maChannelPlaneRatios[uVar1][2] +
         g_maChannelPlaneRatios[uVar2][0] * g_maChannelPlaneRatios[uVar1][0] +
         g_maChannelPlaneRatios[uVar2][1] * g_maChannelPlaneRatios[uVar1][1] + 0.0;
}

Assistant:

static float ma_calculate_channel_position_rectangular_weight(ma_channel channelPositionA, ma_channel channelPositionB)
{
    /*
    Imagine the following simplified example: You have a single input speaker which is the front/left speaker which you want to convert to
    the following output configuration:

     - front/left
     - side/left
     - back/left

    The front/left output is easy - it the same speaker position so it receives the full contribution of the front/left input. The amount
    of contribution to apply to the side/left and back/left speakers, however, is a bit more complicated.

    Imagine the front/left speaker as emitting audio from two planes - the front plane and the left plane. You can think of the front/left
    speaker emitting half of its total volume from the front, and the other half from the left. Since part of its volume is being emitted
    from the left side, and the side/left and back/left channels also emit audio from the left plane, one would expect that they would
    receive some amount of contribution from front/left speaker. The amount of contribution depends on how many planes are shared between
    the two speakers. Note that in the examples below I've added a top/front/left speaker as an example just to show how the math works
    across 3 spatial dimensions.

    The first thing to do is figure out how each speaker's volume is spread over each of plane:
     - front/left:     2 planes (front and left)      = 1/2 = half its total volume on each plane
     - side/left:      1 plane (left only)            = 1/1 = entire volume from left plane
     - back/left:      2 planes (back and left)       = 1/2 = half its total volume on each plane
     - top/front/left: 3 planes (top, front and left) = 1/3 = one third its total volume on each plane

    The amount of volume each channel contributes to each of its planes is what controls how much it is willing to given and take to other
    channels on the same plane. The volume that is willing to the given by one channel is multiplied by the volume that is willing to be
    taken by the other to produce the final contribution.
    */

    /* Contribution = Sum(Volume to Give * Volume to Take) */
    float contribution =
        g_maChannelPlaneRatios[channelPositionA][0] * g_maChannelPlaneRatios[channelPositionB][0] +
        g_maChannelPlaneRatios[channelPositionA][1] * g_maChannelPlaneRatios[channelPositionB][1] +
        g_maChannelPlaneRatios[channelPositionA][2] * g_maChannelPlaneRatios[channelPositionB][2] +
        g_maChannelPlaneRatios[channelPositionA][3] * g_maChannelPlaneRatios[channelPositionB][3] +
        g_maChannelPlaneRatios[channelPositionA][4] * g_maChannelPlaneRatios[channelPositionB][4] +
        g_maChannelPlaneRatios[channelPositionA][5] * g_maChannelPlaneRatios[channelPositionB][5];

    return contribution;
}